

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader15.cpp
# Opt level: O1

void __thiscall COLLADASaxFWL::NodeLoader15::begin__instance_light(NodeLoader15 *this)

{
  instance_light__AttributeData *in_RSI;
  
  begin__instance_light
            ((NodeLoader15 *)&this[-1].super_IParserImpl15.super_ColladaParserAutoGen15,in_RSI);
  return;
}

Assistant:

bool NodeLoader15::begin__instance_light( const COLLADASaxFWL15::instance_light__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__instance_light(attributeData));
COLLADASaxFWL::instance_light__AttributeData attrData;
attrData.present_attributes = 0;
attrData.sid = attributeData.sid;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL15::instance_light__AttributeData::ATTRIBUTE_URL_PRESENT) == COLLADASaxFWL15::instance_light__AttributeData::ATTRIBUTE_URL_PRESENT ) {
    attrData.url = attributeData.url;
    attrData.present_attributes |= COLLADASaxFWL::instance_light__AttributeData::ATTRIBUTE_URL_PRESENT;
}
return mLoader->begin__instance_light(attrData);
}